

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * execute_abi_cxx11_(string *__return_storage_ptr__,char *cmd)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  char buffer [128];
  char acStack_a8 [136];
  
  __stream = popen(cmd,"r");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    error(1,*piVar2,"Pipe error");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  iVar1 = feof(__stream);
  while (iVar1 == 0) {
    pcVar3 = fgets(acStack_a8,0x80,__stream);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    iVar1 = feof(__stream);
  }
  pclose(__stream);
  return __return_storage_ptr__;
}

Assistant:

std::string execute(const char* cmd)
{
    FILE* pipe = popen(cmd, "r");
    if (!pipe)
        error(EXIT_FAILURE, errno, "Pipe error");
    char buffer[128];
    std::string result = "";
    while(!feof(pipe))
        if(fgets(buffer, 128, pipe) != NULL)
            result += buffer;
    pclose(pipe);
    return result;
}